

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void yy_destructor(yyParser *yypParser,unsigned_short yymajor,YYMINORTYPE *yypminor)

{
  Parse *pPVar1;
  int iVar2;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,yymajor);
  if (iVar2 - 0xceU < 0x73) {
    pPVar1 = yypParser->pParse;
    switch(iVar2) {
    case 0xce:
    case 0xf1:
    case 0xf2:
    case 0xfe:
    case 0x100:
      sqlite3SelectDelete(pPVar1->db,yypminor->yy637);
      return;
    case 0xda:
    case 0xdb:
    case 0xf8:
    case 0xfa:
    case 0x10e:
    case 0x119:
    case 0x11b:
    case 0x11e:
    case 0x125:
    case 0x12a:
    case 0x13b:
      sqlite3ExprDelete(pPVar1->db,(yypminor->yy421).pOn);
      return;
    case 0xdf:
    case 0xe9:
    case 0xea:
    case 0xf6:
    case 0xf9:
    case 0xfb:
    case 0xff:
    case 0x101:
    case 0x108:
    case 0x10f:
    case 0x118:
    case 0x11a:
    case 0x13a:
      sqlite3ExprListDelete(pPVar1->db,yypminor->yy402);
      return;
    case 0xf0:
    case 0xf7:
    case 0x103:
    case 0x104:
    case 0x109:
      sqlite3SrcListDelete(pPVar1->db,yypminor->yy563);
      return;
    case 0xf3:
      sqlite3WithDelete(pPVar1->db,yypminor->yy125);
      return;
    case 0xfd:
    case 0x136:
      sqlite3WindowListDelete(pPVar1->db,yypminor->yy483);
      return;
    case 0x10a:
    case 0x111:
      sqlite3IdListDelete(pPVar1->db,yypminor->yy204);
      return;
    case 0x114:
    case 0x137:
    case 0x138:
    case 0x139:
    case 0x13c:
      sqlite3WindowDelete(pPVar1->db,yypminor->yy483);
      return;
    case 0x121:
    case 0x126:
      sqlite3DeleteTriggerStep(pPVar1->db,yypminor->yy319);
      return;
    case 0x123:
      sqlite3IdListDelete(pPVar1->db,(yypminor->yy28).b);
      return;
    case 0x13e:
    case 0x13f:
    case 0x140:
      sqlite3ExprDelete(pPVar1->db,(yypminor->yy205).pExpr);
      return;
    }
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH
  sqlite3ParserCTX_FETCH
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are *not* used
    ** inside the C code.
    */
/********* Begin destructor definitions ***************************************/
    case 206: /* select */
    case 241: /* selectnowith */
    case 242: /* oneselect */
    case 254: /* values */
    case 256: /* mvalues */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy637));
}
      break;
    case 218: /* term */
    case 219: /* expr */
    case 248: /* where_opt */
    case 250: /* having_opt */
    case 270: /* where_opt_ret */
    case 281: /* case_operand */
    case 283: /* case_else */
    case 286: /* vinto */
    case 293: /* when_clause */
    case 298: /* key_opt */
    case 315: /* filter_clause */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy590));
}
      break;
    case 223: /* eidlist_opt */
    case 233: /* sortlist */
    case 234: /* eidlist */
    case 246: /* selcollist */
    case 249: /* groupby_opt */
    case 251: /* orderby_opt */
    case 255: /* nexprlist */
    case 257: /* sclp */
    case 264: /* exprlist */
    case 271: /* setlist */
    case 280: /* paren_exprlist */
    case 282: /* case_exprlist */
    case 314: /* part_opt */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy402));
}
      break;
    case 240: /* fullname */
    case 247: /* from */
    case 259: /* seltablist */
    case 260: /* stl_prefix */
    case 265: /* xfullname */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy563));
}
      break;
    case 243: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy125));
}
      break;
    case 253: /* window_clause */
    case 310: /* windowdefn_list */
{
sqlite3WindowListDelete(pParse->db, (yypminor->yy483));
}
      break;
    case 266: /* idlist */
    case 273: /* idlist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy204));
}
      break;
    case 276: /* filter_over */
    case 311: /* windowdefn */
    case 312: /* window */
    case 313: /* frame_opt */
    case 316: /* over_clause */
{
sqlite3WindowDelete(pParse->db, (yypminor->yy483));
}
      break;
    case 289: /* trigger_cmd_list */
    case 294: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy319));
}
      break;
    case 291: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy28).b);
}
      break;
    case 318: /* frame_bound */
    case 319: /* frame_bound_s */
    case 320: /* frame_bound_e */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy205).pExpr);
}
      break;
/********* End destructor definitions *****************************************/
    default:  break;   /* If no destructor action specified: do nothing */
  }
}